

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,char *zone_title)

{
  int iVar1;
  REF_INT node1;
  REF_NODE ref_node;
  REF_GLOB *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  FILE *pFVar5;
  REF_DBL *scalar;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  REF_CELL pRVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  REF_GATHER pRVar16;
  REF_INT RVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  REF_GLOB *l2c;
  REF_LONG ncell;
  REF_GLOB nnode;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_DBL quality;
  REF_DBL dot;
  REF_INT nodes [27];
  REF_GLOB *local_108;
  REF_CELL local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  REF_GEOM local_e0;
  ulong local_d8;
  REF_EDGE local_d0;
  REF_GATHER local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_HISTOGRAM local_a8 [15];
  
  pRVar16 = ref_grid->gather;
  if (pRVar16->recording == 0) {
    return 0;
  }
  ref_node = ref_grid->node;
  pRVar12 = ref_grid->cell[3];
  local_e0 = ref_grid->geom;
  local_e8 = zone_title;
  if ((ref_grid->mpi->id == 0) && (pRVar16->hist_file == (FILE *)0x0)) {
    pFVar5 = fopen("ref_gather_histo.tec","w");
    pRVar16->hist_file = (FILE *)pFVar5;
    if (pFVar5 == (FILE *)0x0) {
      puts("unable to open ref_gather_histo.tec");
    }
    if ((FILE *)pRVar16->hist_file != (FILE *)0x0) {
      fwrite("title=\"tecplot refine histogram\"\n",0x21,1,(FILE *)pRVar16->hist_file);
      fwrite("variables = \"Edge Length\" \"Normalized Count\"\n",0x2d,1,(FILE *)pRVar16->hist_file)
      ;
      goto LAB_001319d6;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x348,
           "ref_gather_tec_histogram_frame","unable to open file");
    uVar10 = 2;
  }
  else {
LAB_001319d6:
    uVar3 = ref_histogram_create(local_a8);
    if (uVar3 == 0) {
      uVar3 = ref_histogram_resolution(local_a8[0],0x120,12.0);
      if (uVar3 == 0) {
        uVar3 = ref_histogram_add_ratio(local_a8[0],ref_grid);
        if (uVar3 == 0) {
          if ((ref_grid->mpi->id == 0) &&
             (uVar3 = ref_histogram_zone(local_a8[0],pRVar16->hist_file,local_e8,pRVar16->time),
             uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x358,"ref_gather_tec_histogram_frame",(ulong)uVar3,"tec zone");
            uVar10 = (ulong)uVar3;
          }
          else {
            uVar3 = ref_histogram_free(local_a8[0]);
            if (uVar3 != 0) {
              pcVar14 = "free gram";
              uVar6 = 0x35b;
              goto LAB_00131a0a;
            }
            uVar10 = 0;
          }
          goto LAB_00131ac1;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x353,"ref_gather_tec_histogram_frame",(ulong)uVar3,"add ratio");
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x351,"ref_gather_tec_histogram_frame",(ulong)uVar3,"res");
      }
      uVar10 = (ulong)uVar3;
    }
    else {
      pcVar14 = "create";
      uVar6 = 0x350;
LAB_00131a0a:
      uVar10 = (ulong)uVar3;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar6,"ref_gather_tec_histogram_frame",uVar10,pcVar14);
    }
  }
LAB_00131ac1:
  if ((int)uVar10 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x373,
           "ref_gather_tec_movie_frame",uVar10,"hist frame");
    return (int)uVar10;
  }
  local_100 = pRVar12;
  uVar3 = ref_node_synchronize_globals(ref_node);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x375,
           "ref_gather_tec_movie_frame",(ulong)uVar3,"sync");
    uVar10 = (ulong)uVar3;
  }
  if (uVar3 != 0) {
    return (REF_STATUS)uVar10;
  }
  uVar3 = ref_grid_compact_cell_nodes
                    (ref_grid,local_100,(REF_GLOB *)&local_f0,(REF_LONG *)&local_f8,&local_108);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x378,
           "ref_gather_tec_movie_frame",(ulong)uVar3,"l2c");
    uVar10 = (ulong)uVar3;
  }
  pRVar12 = local_100;
  if (uVar3 != 0) {
    return (REF_STATUS)uVar10;
  }
  if (ref_grid->mpi->id == 0) {
    if (pRVar16->grid_file == (FILE *)0x0) {
      pFVar5 = fopen("ref_gather_movie.tec","w");
      pRVar16->grid_file = (FILE *)pFVar5;
      if (pFVar5 == (FILE *)0x0) {
        puts("unable to open ref_gather_movie.tec");
      }
      if ((FILE *)pRVar16->grid_file == (FILE *)0x0) {
        pcVar14 = "unable to open file";
        uVar6 = 0x37f;
        goto LAB_00131f66;
      }
      fwrite("title=\"tecplot refine partition file\"\n",0x26,1,(FILE *)pRVar16->grid_file);
      fwrite("variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n",0x28,1,
             (FILE *)pRVar16->grid_file);
    }
    if (local_e8 == (char *)0x0) {
      pcVar11 = 
      "zone t=\"surf\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n";
      pcVar15 = "fetriangle";
      pcVar13 = "point";
      pcVar14 = local_f8;
      pcVar9 = local_f0;
    }
    else {
      pcVar11 = 
      "zone t=\"%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n";
      pcVar15 = "point";
      pcVar14 = local_f0;
      pcVar9 = local_e8;
      pcVar13 = local_f8;
    }
    fprintf((FILE *)pRVar16->grid_file,pcVar11,pRVar16->time,pcVar9,pcVar14,pcVar13,pcVar15);
  }
  uVar3 = ref_node->max;
  uVar19 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x396,
           "ref_gather_tec_movie_frame","malloc scalar of REF_DBL negative");
    return 1;
  }
  scalar = (REF_DBL *)malloc((ulong)(uVar3 * 4) << 3);
  if (scalar == (REF_DBL *)0x0) {
    pcVar14 = "malloc scalar of REF_DBL NULL";
    uVar6 = 0x396;
LAB_00131f66:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
           "ref_gather_tec_movie_frame",pcVar14);
    return 2;
  }
  if (uVar19 != 0) {
    pRVar2 = ref_node->global;
    lVar7 = 0;
    do {
      if (-1 < *(long *)((long)pRVar2 + lVar7 * 2)) {
        scalar[lVar7] = 2.0;
        scalar[lVar7 + 1] = 1.0;
        scalar[lVar7 + 2] = 1.0;
        scalar[lVar7 + 3] = (double)*(int *)((long)ref_node->part + lVar7);
      }
      lVar7 = lVar7 + 4;
    } while (uVar19 * 4 - lVar7 != 0);
  }
  if (local_e0->model == (void *)0x0) {
    if (ref_grid->twod == 0) goto LAB_00132219;
    local_d8 = uVar19;
    if (local_e0->meshlink != (void *)0x0) goto LAB_00131e19;
  }
  else {
LAB_00131e19:
    local_d8 = uVar19;
    if (0 < pRVar12->max) {
      RVar17 = 0;
      do {
        RVar4 = ref_cell_nodes(pRVar12,RVar17,(REF_INT *)local_a8);
        if (RVar4 == 0) {
          uVar3 = ref_geom_tri_norm_deviation(ref_grid,(REF_INT *)local_a8,&local_b0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x3a0,"ref_gather_tec_movie_frame",(ulong)uVar3,"norm dev");
            uVar10 = (ulong)uVar3;
          }
          if (uVar3 != 0) {
            return (REF_STATUS)uVar10;
          }
          iVar18 = local_100->node_per;
          pRVar12 = local_100;
          if (0 < (long)iVar18) {
            lVar7 = 0;
            do {
              lVar8 = (long)*(int *)((long)local_a8 + lVar7 * 4);
              dVar20 = scalar[lVar8 * 4];
              if (local_b0 <= scalar[lVar8 * 4]) {
                dVar20 = local_b0;
              }
              scalar[lVar8 * 4] = dVar20;
              lVar7 = lVar7 + 1;
            } while (iVar18 != lVar7);
          }
        }
        RVar17 = RVar17 + 1;
      } while (RVar17 < pRVar12->max);
    }
  }
  local_c8 = pRVar16;
  if ((ref_grid->twod != 0) && (0 < pRVar12->max)) {
    iVar18 = 0;
    do {
      RVar4 = ref_cell_nodes(pRVar12,iVar18,(REF_INT *)local_a8);
      if (RVar4 == 0) {
        uVar3 = ref_node_tri_quality(ref_node,(REF_INT *)local_a8,&local_b8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x3a9,"ref_gather_tec_movie_frame",(ulong)uVar3,"tri qual");
          uVar10 = (ulong)uVar3;
        }
        if (uVar3 != 0) {
          return (REF_STATUS)uVar10;
        }
        iVar1 = local_100->node_per;
        pRVar12 = local_100;
        if (0 < (long)iVar1) {
          lVar7 = 0;
          do {
            lVar8 = (long)*(int *)((long)local_a8 + lVar7 * 4);
            dVar20 = scalar[lVar8 * 4];
            if (local_b8 <= scalar[lVar8 * 4]) {
              dVar20 = local_b8;
            }
            scalar[lVar8 * 4] = dVar20;
            lVar7 = lVar7 + 1;
          } while (iVar1 != lVar7);
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < pRVar12->max);
  }
  uVar3 = ref_edge_create(&local_d0,ref_grid);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x3b0,
           "ref_gather_tec_movie_frame",(ulong)uVar3,"create edges");
    uVar10 = (ulong)uVar3;
  }
  if (uVar3 != 0) {
    return (REF_STATUS)uVar10;
  }
  if (0 < local_d0->n) {
    lVar7 = 0;
    do {
      RVar17 = local_d0->e2n[lVar7 * 2];
      node1 = local_d0->e2n[lVar7 * 2 + 1];
      local_e0 = (REF_GEOM)CONCAT44(local_e0._4_4_,node1);
      uVar3 = ref_node_ratio(ref_node,RVar17,node1,&local_c0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x3b4,"ref_gather_tec_movie_frame",(ulong)uVar3,"ratio");
        uVar10 = (ulong)uVar3;
      }
      if (uVar3 != 0) {
        return (REF_STATUS)uVar10;
      }
      dVar20 = scalar[(long)RVar17 * 4 + 1];
      if (local_c0 <= scalar[(long)RVar17 * 4 + 1]) {
        dVar20 = local_c0;
      }
      scalar[(long)RVar17 * 4 + 1] = dVar20;
      dVar20 = scalar[(long)(int)local_e0 * 4 + 1];
      if (local_c0 <= scalar[(long)(int)local_e0 * 4 + 1]) {
        dVar20 = local_c0;
      }
      scalar[(long)(int)local_e0 * 4 + 1] = dVar20;
      uVar3 = RVar17 * 4 | 2;
      dVar20 = scalar[(int)uVar3];
      if (scalar[(int)uVar3] <= local_c0) {
        dVar20 = local_c0;
      }
      scalar[(int)uVar3] = dVar20;
      uVar3 = (int)local_e0 * 4 | 2;
      dVar20 = scalar[(int)uVar3];
      if (scalar[(int)uVar3] <= local_c0) {
        dVar20 = local_c0;
      }
      scalar[(int)uVar3] = dVar20;
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_d0->n);
  }
  uVar3 = ref_edge_free(local_d0);
  pRVar16 = local_c8;
  uVar19 = local_d8;
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x3ba,
           "ref_gather_tec_movie_frame",(ulong)uVar3,"free edges");
    return uVar3;
  }
LAB_00132219:
  uVar3 = ref_gather_node_tec_part
                    (ref_node,(REF_GLOB)local_f0,local_108,4,scalar,pRVar16->grid_file);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x3d3,
           "ref_gather_tec_movie_frame",(ulong)uVar3,"nodes");
    return uVar3;
  }
  uVar3 = ref_gather_cell_tec(ref_node,local_100,(REF_LONG)local_f8,local_108,0,pRVar16->grid_file);
  if (uVar3 == 0) {
    if (local_108 != (REF_GLOB *)0x0) {
      free(local_108);
    }
    if (pRVar16->low_quality_zone != 0) {
      uVar3 = ref_gather_cell_below_quality
                        (ref_grid,ref_grid->cell[8],pRVar16->min_quality,(REF_GLOB *)&local_f0,
                         (REF_LONG *)&local_f8,&local_108);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x3dd,"ref_gather_tec_movie_frame",(ulong)uVar3,"cell below");
        return uVar3;
      }
      if (0 < (long)local_f8 && uVar19 != 0) {
        if (ref_grid->mpi->id == 0) {
          if (local_e8 == (char *)0x0) {
            pcVar11 = 
            "zone t=\"qtet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
            ;
            pcVar15 = "fetetrahedron";
            pcVar13 = "point";
            pcVar14 = local_f8;
            pcVar9 = local_f0;
          }
          else {
            pcVar11 = 
            "zone t=\"q%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
            ;
            pcVar15 = "point";
            pcVar14 = local_f0;
            pcVar9 = local_e8;
            pcVar13 = local_f8;
          }
          fprintf((FILE *)pRVar16->grid_file,pcVar11,pRVar16->time,pcVar9,pcVar14,pcVar13,pcVar15);
        }
        uVar3 = ref_gather_node_tec_part
                          (ref_node,(REF_GLOB)local_f0,local_108,4,scalar,pRVar16->grid_file);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x3f2,"ref_gather_tec_movie_frame",(ulong)uVar3,"nodes");
          return uVar3;
        }
        uVar3 = ref_gather_cell_quality_tec
                          (ref_node,ref_grid->cell[8],(REF_LONG)local_f8,local_108,
                           pRVar16->min_quality,pRVar16->grid_file);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x3f6,"ref_gather_tec_movie_frame",(ulong)uVar3,"qtet");
          return uVar3;
        }
      }
      if (local_108 != (REF_GLOB *)0x0) {
        free(local_108);
      }
    }
    if (ref_grid->mpi->id == 0) {
      iVar18 = fflush((FILE *)pRVar16->grid_file);
      if (iVar18 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x3fc,"ref_gather_tec_movie_frame","gather movie fflush",0,(long)iVar18);
        return 1;
      }
      pRVar16->time = pRVar16->time + 1.0;
    }
    free(scalar);
    return 0;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x3d6,
         "ref_gather_tec_movie_frame",(ulong)uVar3,"t");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,
                                              const char *zone_title) {
  REF_GATHER ref_gather = ref_grid_gather(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_DBL *scalar, dot, quality;
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_INT ldim = 4;
  REF_BOOL metric_area = REF_FALSE;

  if (!(ref_gather->recording)) return REF_SUCCESS;

  RSS(ref_gather_tec_histogram_frame(ref_grid, zone_title), "hist frame");

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");

  if (ref_grid_once(ref_grid)) {
    if (NULL == (void *)(ref_gather->grid_file)) {
      ref_gather->grid_file = fopen("ref_gather_movie.tec", "w");
      if (NULL == (void *)(ref_gather->grid_file))
        printf("unable to open ref_gather_movie.tec\n");
      RNS(ref_gather->grid_file, "unable to open file");

      fprintf(ref_gather->grid_file,
              "title=\"tecplot refine partition file\"\n");
      fprintf(ref_gather->grid_file,
              "variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n");
    }
    if (NULL == zone_title) {
      fprintf(ref_gather->grid_file,
              "zone t=\"surf\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              nnode, ncell, "point", "fetriangle", ref_gather->time);
    } else {
      fprintf(ref_gather->grid_file,
              "zone t=\"%s\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              zone_title, nnode, ncell, "point", "fetriangle",
              ref_gather->time);
    }
  }

  ref_malloc(scalar, ldim * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    scalar[0 + ldim * node] = 2.0;
    scalar[1 + ldim * node] = 1.0;
    scalar[2 + ldim * node] = 1.0;
    scalar[3 + ldim * node] = (REF_DBL)ref_node_part(ref_node, node);
  }
  if (ref_geom_model_loaded(ref_geom) || ref_grid_twod(ref_grid)) {
    if (ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &dot), "norm dev");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], dot);
        }
      }
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], quality);
        }
      }
    }
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
      scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
      scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
      scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
      scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
    }
    RSS(ref_edge_free(ref_edge), "free edges");
  }

  if (metric_area && ref_grid_twod(ref_grid)) {
    REF_DBL area;
    REF_INT i, *hits;
    ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
    each_ref_node_valid_node(ref_node, node) { scalar[3 + ldim * node] = 0.0; }
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
      for (i = 0; i < 3; i++) {
        scalar[3 + ldim * nodes[i]] += area;
        (hits[nodes[i]])++;
      }
    }
    each_ref_node_valid_node(ref_node, node) {
      if (hits[node] > 0) {
        scalar[3 + ldim * node] /= ((REF_DBL)hits[node]);
      }
    }
    ref_free(hits);
  }

  RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                               ref_gather->grid_file),
      "nodes");
  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE,
                          ref_gather->grid_file),
      "t");
  ref_free(l2c);

  if (ref_gather_low_quality_zone(ref_gather)) {
    RSS(ref_gather_cell_below_quality(ref_grid, ref_grid_tet(ref_grid),
                                      ref_gather->min_quality, &nnode, &ncell,
                                      &l2c),
        "cell below");

    if (node > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        if (NULL == zone_title) {
          fprintf(ref_gather->grid_file,
                  "zone t=\"qtet\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  nnode, ncell, "point", "fetetrahedron", ref_gather->time);
        } else {
          fprintf(ref_gather->grid_file,
                  "zone t=\"q%s\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  zone_title, nnode, ncell, "point", "fetetrahedron",
                  ref_gather->time);
        }
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                                   ref_gather->grid_file),
          "nodes");
      RSS(ref_gather_cell_quality_tec(ref_node, ref_grid_tet(ref_grid), ncell,
                                      l2c, ref_gather->min_quality,
                                      ref_gather->grid_file),
          "qtet");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) {
    REIS(0, fflush(ref_gather->grid_file), "gather movie fflush");
    (ref_gather->time) += 1.0;
  }

  ref_free(scalar);

  return REF_SUCCESS;
}